

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_validate(lyd_node **node,int options,void *var_arg,...)

{
  long *plVar1;
  char in_AL;
  int iVar2;
  void *pvVar3;
  lyd_node *plVar4;
  lyd_difflist **in_RCX;
  char *format;
  lyd_node *data_tree;
  undefined8 in_R8;
  undefined8 in_R9;
  lyd_difflist **diff;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [24];
  lyd_difflist **local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  va_list ap;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  if (node == (lyd_node **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_validate");
    return 1;
  }
  iVar2 = lyp_data_check_options((ly_ctx *)0x0,options,"lyd_validate");
  if (iVar2 != 0) {
    return 1;
  }
  data_tree = *node;
  if (data_tree == (lyd_node *)0x0 && ((options & 0xfU) != 0 || (options & 0x10000ffU) == 0)) {
    if (var_arg != (void *)0x0) {
      options = options & 0xffffefff;
LAB_0016d55b:
      if (((uint)options >> 0x12 & 1) == 0) {
        diff = (lyd_difflist **)0x0;
LAB_0016d5b8:
        if (*node != (lyd_node *)0x0) {
          if ((ly_ctx *)var_arg == (ly_ctx *)0x0) {
            var_arg = (*node)->schema->module->ctx;
          }
          if (((uint)options >> 0xc & 1) == 0) {
            plVar4 = *node;
            while (plVar4 = plVar4->prev, plVar4->next != (lyd_node *)0x0) {
              *node = plVar4;
            }
          }
        }
        iVar2 = _lyd_validate(node,data_tree,(ly_ctx *)var_arg,(lys_module **)0x0,0,diff,options);
        return iVar2;
      }
      ap[0].overflow_arg_area = local_f8;
      ap[0]._0_8_ = &stack0x00000008;
      local_48 = 0x3000000020;
      diff = local_e0;
      if (local_e0 != (lyd_difflist **)0x0) goto LAB_0016d5b8;
      format = "%s: invalid variable parameter (struct lyd_difflist **).";
      goto LAB_0016d62d;
    }
    format = "%s: invalid variable parameter (struct ly_ctx *ctx).";
  }
  else if ((options & 0x70U) == 0) {
    if ((data_tree == (lyd_node *)0x0 || ((uint)options >> 0x18 & 1) == 0) ||
       ((data_tree->prev->next == (lyd_node *)0x0 && (data_tree->next == (lyd_node *)0x0))))
    goto LAB_0016d558;
    format = "%s: invalid variable parameter (struct lyd_node *node).";
  }
  else if (((uint)options >> 0xc & 1) == 0) {
    if (data_tree != (lyd_node *)0x0) {
      if (var_arg == (void *)0x0) {
        data_tree = (lyd_node *)0x0;
      }
      else {
        pvVar3 = var_arg;
        if ((short)options < 0) {
          format = 
          "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set)."
          ;
          goto LAB_0016d624;
        }
        do {
          if (*(long *)((long)pvVar3 + 0x28) != 0) {
            format = "%s: invalid variable parameter (const struct lyd_node *data_tree).";
            goto LAB_0016d624;
          }
          plVar1 = (long *)((long)pvVar3 + 0x18);
          pvVar3 = (void *)*plVar1;
        } while ((void *)*plVar1 != (void *)0x0);
        do {
          data_tree = (lyd_node *)var_arg;
          var_arg = data_tree->prev;
        } while (data_tree->prev->next != (lyd_node *)0x0);
      }
LAB_0016d558:
      var_arg = (ly_ctx *)0x0;
      goto LAB_0016d55b;
    }
    format = "Invalid arguments (%s()).";
  }
  else {
    format = 
    "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS)."
    ;
  }
LAB_0016d624:
  var_arg = (ly_ctx *)0x0;
LAB_0016d62d:
  ly_log((ly_ctx *)var_arg,LY_LLERR,LY_EINVAL,format,"lyd_validate");
  return 1;
}

Assistant:

API int
lyd_validate(struct lyd_node **node, int options, void *var_arg, ...)
{
    struct lyd_node *iter, *data_tree = NULL;
    struct lyd_difflist **diff = NULL;
    struct ly_ctx *ctx = NULL;
    va_list ap;

    if (!node) {
        LOGARG;
        return EXIT_FAILURE;
    }

    if (lyp_data_check_options(NULL, options, __func__)) {
        return EXIT_FAILURE;
    }

    data_tree = *node;

    if ((!(options & LYD_OPT_TYPEMASK)
            || (options & (LYD_OPT_CONFIG | LYD_OPT_GET | LYD_OPT_GETCONFIG | LYD_OPT_EDIT))) && !(*node)) {
        /* get context with schemas from the var_arg */
        ctx = (struct ly_ctx *)var_arg;
        if (!ctx) {
            LOGERR(NULL, LY_EINVAL, "%s: invalid variable parameter (struct ly_ctx *ctx).", __func__);
            return EXIT_FAILURE;
        }

        /* LYD_OPT_NOSIBLINGS has no meaning here */
        options &= ~LYD_OPT_NOSIBLINGS;
    } else if (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF)) {
        /* LYD_OPT_NOSIBLINGS cannot be set in this case */
        if (options & LYD_OPT_NOSIBLINGS) {
            LOGERR(NULL, LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS).", __func__);
            return EXIT_FAILURE;
        } else if (!(*node)) {
            LOGARG;
            return EXIT_FAILURE;
        }

        /* get the additional data tree if given */
        data_tree = (struct lyd_node *)var_arg;
        if (data_tree) {
            if (options & LYD_OPT_NOEXTDEPS) {
                LOGERR(NULL, LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set).",
                       __func__);
                return EXIT_FAILURE;
            }

            LY_TREE_FOR(data_tree, iter) {
                if (iter->parent) {
                    /* a sibling is not top-level */
                    LOGERR(NULL, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *data_tree).", __func__);
                    return EXIT_FAILURE;
                }
            }

            /* move it to the beginning */
            for (; data_tree->prev->next; data_tree = data_tree->prev);
        }
    } else if (options & LYD_OPT_DATA_TEMPLATE) {
        /* get context with schemas from the var_arg */
        if (*node && ((*node)->prev->next || (*node)->next)) {
            /* not allow sibling in top-level */
            LOGERR(NULL, LY_EINVAL, "%s: invalid variable parameter (struct lyd_node *node).", __func__);
            return EXIT_FAILURE;
        }
    }

    if (options & LYD_OPT_VAL_DIFF) {
        va_start(ap, var_arg);
        diff = va_arg(ap, struct lyd_difflist **);
        va_end(ap);
        if (!diff) {
            LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (struct lyd_difflist **).", __func__);
            return EXIT_FAILURE;
        }
    }

    if (*node) {
        if (!ctx) {
            ctx = (*node)->schema->module->ctx;
        }
        if (!(options & LYD_OPT_NOSIBLINGS)) {
            /* check that the node is the first sibling */
            while ((*node)->prev->next) {
                *node = (*node)->prev;
            }
        }
    }

    return _lyd_validate(node, data_tree, ctx, NULL, 0, diff, options);
}